

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall ON_MeshCacheItem::Dump(ON_MeshCacheItem *this,ON_TextLog *text_log)

{
  ON_Mesh *pOVar1;
  ON_MeshParameters *a;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *format;
  char buffer [48];
  char local_48 [48];
  
  bVar2 = ::operator==(&ON_MeshCache::RenderMeshId,&this->m_mesh_id);
  if (bVar2) {
    pcVar5 = "Render Mesh";
LAB_0051c0e9:
    bVar2 = false;
  }
  else {
    bVar2 = ::operator==(&ON_MeshCache::AnalysisMeshId,&this->m_mesh_id);
    if (bVar2) {
      pcVar5 = "Analysis Mesh";
      goto LAB_0051c0e9;
    }
    bVar3 = ::operator==(&ON_MeshCache::PreviewMeshId,&this->m_mesh_id);
    bVar2 = !bVar3;
    pcVar5 = (char *)0x0;
    if (bVar3) {
      pcVar5 = "Preview Mesh";
    }
  }
  if (bVar2) {
    local_48[0x20] = '\0';
    local_48[0x21] = '\0';
    local_48[0x22] = '\0';
    local_48[0x23] = '\0';
    local_48[0x24] = '\0';
    local_48[0x25] = '\0';
    local_48[0x26] = '\0';
    local_48[0x27] = '\0';
    local_48[0x28] = '\0';
    local_48[0x29] = '\0';
    local_48[0x2a] = '\0';
    local_48[0x2b] = '\0';
    local_48[0x2c] = '\0';
    local_48[0x2d] = '\0';
    local_48[0x2e] = '\0';
    local_48[0x2f] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[0x18] = '\0';
    local_48[0x19] = '\0';
    local_48[0x1a] = '\0';
    local_48[0x1b] = '\0';
    local_48[0x1c] = '\0';
    local_48[0x1d] = '\0';
    local_48[0x1e] = '\0';
    local_48[0x1f] = '\0';
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    ON_UuidToString(&this->m_mesh_id,local_48);
    format = "mesh id: %s\n";
    pcVar5 = local_48;
  }
  else {
    format = "%s\n";
  }
  ON_TextLog::Print(text_log,format,pcVar5);
  ON_TextLog::PushIndent(text_log);
  pOVar1 = (this->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pOVar1 == (ON_Mesh *)0x0) {
    pcVar5 = "Null mesh\n";
  }
  else {
    if ((pOVar1 != &ON_Mesh::Empty) &&
       ((pOVar1->m_F).m_count != 0 || (pOVar1->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count != 0))
    {
      a = pOVar1->m_mesh_parameters;
      if (a == (ON_MeshParameters *)0x0) {
        pcVar5 = "Custom";
      }
      else {
        iVar4 = ON_MeshParameters::CompareGeometrySettings
                          (a,&ON_MeshParameters::FastRenderMesh,false);
        if (iVar4 == 0) {
          pcVar5 = "Fast";
        }
        else {
          iVar4 = ON_MeshParameters::CompareGeometrySettings
                            (a,&ON_MeshParameters::QualityRenderMesh,false);
          pcVar5 = "Custom";
          if (iVar4 == 0) {
            pcVar5 = "Quality";
          }
        }
      }
      ON_TextLog::Print(text_log,"%s mesh with %d faces and %d vertices.\n",pcVar5,
                        (ulong)(uint)(pOVar1->m_F).m_count,
                        (ulong)(uint)(pOVar1->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count);
      goto LAB_0051c209;
    }
    pcVar5 = "Empty mesh\n";
  }
  ON_TextLog::Print(text_log,pcVar5);
LAB_0051c209:
  ON_TextLog::PopIndent(text_log);
  return;
}

Assistant:

void ON_MeshCacheItem::Dump(
  ON_TextLog& text_log
  ) const
{
  const char* description = nullptr;
  if ( ON_MeshCache::RenderMeshId == m_mesh_id )
    description = "Render Mesh";
  else if ( ON_MeshCache::AnalysisMeshId == m_mesh_id )
    description = "Analysis Mesh";
  else if ( ON_MeshCache::PreviewMeshId == m_mesh_id )
    description = "Preview Mesh";

  if (nullptr != description)
  {
    text_log.Print("%s\n", description);
  }
  else
  {
    char buffer[48] = { 0 };
    ON_UuidToString(m_mesh_id, buffer);
    text_log.Print("mesh id: %s\n",buffer);
  }

  text_log.PushIndent();
  const ON_Mesh* mesh = m_mesh_sp.get();
  if (nullptr == mesh)
    text_log.Print("Null mesh\n");
  else if (mesh->IsEmpty())
    text_log.Print("Empty mesh\n");
  else
  {
    const char* mp_style = "Custom";
    const ON_MeshParameters* mp = mesh->MeshParameters();
    if (mp)
    {
      if (0 == ON_MeshParameters::CompareGeometrySettings(*mp, ON_MeshParameters::FastRenderMesh))
        mp_style = "Fast";
      else if (0 == ON_MeshParameters::CompareGeometrySettings(*mp, ON_MeshParameters::QualityRenderMesh))
        mp_style = "Quality";
    }
    text_log.Print("%s mesh with %d faces and %d vertices.\n", mp_style, mesh->FaceCount(), mesh->VertexCount());
  }
  text_log.PopIndent();
}